

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::Scrollbar(ImGuiAxis axis)

{
  ImGuiWindow *window;
  ImDrawList *this;
  undefined1 auVar1 [12];
  ulong uVar2;
  ImGuiContext *pIVar3;
  undefined4 id;
  ImGuiID id_00;
  ImU32 IVar4;
  ImVec2 *pIVar5;
  undefined7 extraout_var;
  ImRect *pIVar6;
  ImGuiCol idx;
  float *pfVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  int iVar15;
  float fVar16;
  int iVar21;
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  int iVar23;
  undefined8 extraout_XMM0_Qb;
  int iVar24;
  undefined1 auVar19 [16];
  float fVar22;
  undefined1 auVar20 [16];
  undefined8 in_XMM1_Qa;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  ImRect IVar41;
  bool held;
  bool hovered;
  ImRect local_118;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  ImGuiID local_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  ImVec2 local_68;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  ImVec2 local_40;
  ImVec2 local_38;
  undefined1 auVar28 [16];
  undefined1 auVar33 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  
  pIVar3 = GImGui;
  window = GImGui->CurrentWindow;
  id_00 = GetScrollbarID(window,axis);
  KeepAliveID(id_00);
  bVar8 = (&window->ScrollbarX)[axis == ImGuiAxis_X];
  _local_d8 = ZEXT816(0);
  if (bVar8 == true) {
    _local_d8 = ZEXT416((uint)(pIVar3->Style).ScrollbarSize);
  }
  IVar41 = ImGuiWindow::Rect(window);
  local_68 = IVar41.Max;
  fVar13 = window->WindowBorderSize;
  local_108._0_4_ = IVar41.Max.x;
  local_58 = IVar41.Max.y;
  fStack_fc = (float)((ulong)in_XMM1_Qa >> 0x20);
  fVar14 = IVar41.Min.x;
  fVar22 = IVar41.Min.y;
  fVar36 = (float)((ulong)extraout_XMM0_Qb >> 0x20);
  if (axis == ImGuiAxis_X) {
    auVar32._0_4_ = fVar13 + fVar14;
    auVar35._4_8_ = 0;
    auVar35._0_4_ = auVar32._0_4_;
    auVar35._12_4_ = local_58;
    auVar32._8_8_ = auVar35._8_8_;
    auVar32._4_4_ = local_58 - (pIVar3->Style).ScrollbarSize;
    local_108._0_4_ = (float)local_108._0_4_ - (float)local_d8._0_4_;
    local_108._4_4_ = local_58;
  }
  else {
    auVar30._8_4_ = (float)in_XMM1_Qa;
    auVar30._0_4_ = local_68.x;
    auVar30._4_4_ = local_68.y;
    auVar30._12_4_ = fStack_fc;
    auVar31._4_12_ = auVar30._4_12_;
    auVar31._0_4_ = (float)local_108._0_4_ - (pIVar3->Style).ScrollbarSize;
    auVar33._0_8_ = auVar31._0_8_;
    auVar33._8_4_ = local_58;
    auVar33._12_4_ = fVar22;
    auVar32._8_8_ = auVar33._8_8_;
    auVar32._4_4_ = fVar22 + fVar13;
    auVar32._0_4_ = auVar31._0_4_;
    local_108._4_4_ = local_58 - (float)local_d8._0_4_;
  }
  local_108._0_4_ = (float)local_108._0_4_ - fVar13;
  local_108._4_4_ = (float)local_108._4_4_ - fVar13;
  fStack_100 = (float)in_XMM1_Qa - fVar13;
  fStack_fc = fStack_fc - fVar13;
  uVar9 = -(uint)(auVar32._0_4_ <= fVar14);
  uVar10 = -(uint)(auVar32._4_4_ <= fVar22);
  uVar11 = -(uint)(auVar32._8_4_ <= (float)extraout_XMM0_Qb);
  uVar12 = -(uint)(auVar32._12_4_ <= fVar36);
  local_c8._0_4_ = ~uVar9 & (uint)auVar32._0_4_ | (uint)fVar14 & uVar9;
  local_118.Min.y = (float)(~uVar10 & (uint)auVar32._4_4_ | (uint)fVar22 & uVar10);
  fStack_c0 = (float)(~uVar11 & (uint)auVar32._8_4_ | (uint)(float)extraout_XMM0_Qb & uVar11);
  fStack_bc = (float)(~uVar12 & (uint)auVar32._12_4_ | (uint)fVar36 & uVar12);
  local_118.Min.x = (float)local_c8._0_4_;
  fStack_54 = local_58;
  fStack_50 = local_58;
  fStack_4c = local_58;
  local_118.Max.x = (float)local_108._0_4_;
  local_118.Max.y = (float)local_108._4_4_;
  if (axis != ImGuiAxis_X) {
    local_e8 = (ImGuiContext *)CONCAT44(local_118.Min.y,local_118.Min.y);
    local_c8._4_4_ = local_118.Min.y;
    fStack_e0 = local_118.Min.y;
    fStack_dc = local_118.Min.y;
    fVar13 = ImGuiWindow::TitleBarHeight(window);
    fVar14 = 0.0;
    if ((window->Flags & 0x400) != 0) {
      local_f8._0_4_ = fVar13;
      fVar14 = ImGuiWindow::MenuBarHeight(window);
      fVar13 = (float)local_f8._0_4_;
    }
    local_118.Min.y = (float)local_e8 + fVar13 + fVar14;
  }
  local_108._4_4_ = (float)local_108._4_4_ - local_118.Min.y;
  fStack_fc = fStack_fc - fStack_bc;
  if ((float)local_108._0_4_ - (float)local_c8._0_4_ <= 0.0) {
    return;
  }
  if ((float)local_108._4_4_ <= 0.0) {
    return;
  }
  if (axis == ImGuiAxis_Y) {
    fVar13 = (pIVar3->Style).FramePadding.y;
    fVar13 = fVar13 + fVar13;
    if (fVar13 + pIVar3->FontSize <= (float)local_108._4_4_) {
      auVar18 = ZEXT812(0x3f800000);
    }
    else {
      fVar13 = ((float)local_108._4_4_ - pIVar3->FontSize) / fVar13;
      auVar17 = ZEXT812(0x3f800000);
      if (fVar13 <= 1.0) {
        auVar17._4_8_ = 0;
        auVar17._0_4_ = fVar13;
      }
      auVar18._0_4_ = (float)(~-(uint)(fVar13 < 0.0) & auVar17._0_4_);
      auVar18._4_4_ = 0;
      auVar18._8_4_ = ~local_108._4_4_ & auVar17._8_4_;
      if (auVar18._0_4_ <= 0.0) {
        return;
      }
    }
    local_a8[0] = 1.0 <= auVar18._0_4_;
  }
  else {
    if (axis == ImGuiAxis_X) {
      iVar15 = (uint)(bVar8 ^ 1) * 8 + 4;
      auVar18 = ZEXT812(0x3f800000);
      local_a8[0] = 1;
      goto LAB_0012cdd5;
    }
    auVar18 = ZEXT812(0x3f800000);
    local_a8[0] = 1;
  }
  iVar15 = ((uint)~window->Flags >> 9 & -(window->Flags & 1U) & 2) + (uint)(bVar8 ^ 1) * 8;
LAB_0012cdd5:
  local_108._0_4_ = (float)local_108._0_4_ - (float)local_c8._0_4_;
  fStack_100 = fStack_100 - fStack_c0;
  fStack_bc = 0.0;
  _local_c8 = auVar18;
  local_e8 = pIVar3;
  local_f8._0_4_ = id_00;
  this = window->DrawList;
  IVar4 = GetColorU32(0xe,1.0);
  ImDrawList::AddRectFilled(this,&local_118.Min,&local_118.Max,IVar4,window->WindowRounding,iVar15);
  pIVar3 = local_e8;
  iVar15 = (int)(((float)local_108._0_4_ + -2.0) * 0.5);
  iVar21 = (int)(((float)local_108._4_4_ + -2.0) * 0.5);
  iVar23 = (int)((fStack_100 + 0.0) * 0.0);
  iVar24 = (int)((fStack_fc + 0.0) * 0.0);
  auVar34._0_4_ = -(uint)(iVar15 < 0);
  auVar34._4_4_ = -(uint)(iVar21 < 0);
  auVar34._8_4_ = -(uint)(iVar23 < 0);
  auVar34._12_4_ = -(uint)(iVar24 < 0);
  auVar19._0_4_ = -(uint)(3 < iVar15);
  auVar19._4_4_ = -(uint)(3 < iVar21);
  auVar19._8_4_ = -(uint)(0 < iVar23);
  auVar19._12_4_ = -(uint)(0 < iVar24);
  auVar25._0_8_ = CONCAT44((float)iVar21,(float)iVar15) ^ 0x8000000080000000;
  auVar25._8_4_ = -(float)iVar23;
  auVar25._12_4_ = -(float)iVar24;
  auVar35 = auVar34 & _DAT_00167860 | ~auVar34 & (auVar19 & _DAT_00167850 | ~auVar19 & auVar25);
  fVar13 = auVar35._0_4_;
  fVar14 = auVar35._4_4_;
  auVar26._0_8_ = auVar35._0_8_;
  auVar26._8_4_ = fVar13;
  auVar26._12_4_ = fVar14;
  local_118.Min.x = local_118.Min.x - fVar13;
  fVar22 = local_118.Min.y - fVar14;
  fVar13 = local_118.Max.x + fVar13;
  fVar36 = local_118.Max.y + fVar14;
  auVar1._4_8_ = auVar26._8_8_;
  auVar1._0_4_ = local_118.Min.y + fVar14;
  auVar27._0_8_ = auVar1._0_8_ << 0x20;
  auVar27._8_4_ = fVar13;
  auVar27._12_4_ = fVar36;
  local_118.Max = auVar27._8_8_;
  bVar8 = axis != ImGuiAxis_X;
  fVar14 = local_118.Min.x;
  if (bVar8) {
    fVar13 = fVar36;
    fVar14 = fVar22;
  }
  fVar14 = fVar13 - fVar14;
  id = local_f8._0_4_;
  fVar16 = (&(window->SizeContents).x)[bVar8];
  _local_108 = ZEXT416((uint)fVar16);
  fVar37 = (&(window->SizeFull).x)[bVar8] - (float)local_d8._0_4_;
  _local_98 = ZEXT416((uint)fVar37);
  fVar16 = (float)(~-(uint)(fVar37 <= fVar16) & (uint)fVar37 |
                  -(uint)(fVar37 <= fVar16) & (uint)fVar16);
  local_118.Min.y = fVar22;
  if (0.0 < fVar16) {
    pfVar7 = &(window->Scroll).y;
    pIVar5 = (ImVec2 *)pfVar7;
    if (axis == ImGuiAxis_X) {
      pIVar5 = &window->Scroll;
    }
    if (fVar16 <= 1.0) {
      fVar16 = 1.0;
    }
    fVar37 = (fVar37 / fVar16) * fVar14;
    fVar22 = (local_e8->Style).GrabMinSize;
    fVar16 = fVar14;
    if (fVar37 <= fVar14) {
      fVar16 = fVar37;
    }
    uVar9 = -(uint)(fVar37 < fVar22);
    local_d8._4_4_ = fVar36;
    local_d8._0_4_ = uVar9 & (uint)fVar22 | ~uVar9 & (uint)fVar16;
    fStack_d0 = fVar13;
    fStack_cc = fVar36;
    local_f8 = ZEXT416((uint)pIVar5->x);
    held = false;
    hovered = false;
    local_ac = local_e8->ActiveId;
    fStack_e0 = fVar13;
    fStack_dc = fVar36;
    local_e8._0_4_ = fVar14;
    local_e8._4_4_ = fVar36;
    bVar8 = ButtonBehavior(&local_118,id,&hovered,&held,0x2000);
    fVar13 = 1.0;
    if (1.0 <= (float)local_108._0_4_ - (float)local_98._0_4_) {
      fVar13 = (float)local_108._0_4_ - (float)local_98._0_4_;
    }
    fVar36 = (float)local_e8 - local_d8._0_4_;
    auVar39._8_4_ = local_d8._4_4_;
    auVar39._0_8_ = local_d8;
    auVar39._12_4_ = local_d8._12_4_;
    auVar38._8_8_ = auVar39._8_8_;
    auVar38._4_4_ = local_f8._0_4_;
    auVar38._0_4_ = local_d8._0_4_;
    auVar40._0_12_ = auVar38._0_12_;
    auVar40._12_4_ = local_f8._4_4_;
    auVar20._4_4_ = fVar13;
    auVar20._0_4_ = (float)local_e8;
    auVar20._8_4_ = local_e8._4_4_;
    auVar20._12_4_ = 0;
    auVar35 = divps(auVar40,auVar20);
    fVar22 = auVar35._4_4_;
    iVar15 = -(uint)(auVar35._0_4_ < 1.0);
    iVar21 = -(uint)(fVar22 < 0.0);
    auVar29._4_4_ = iVar21;
    auVar29._0_4_ = iVar15;
    auVar29._8_4_ = iVar21;
    auVar29._12_4_ = iVar21;
    auVar28._8_8_ = auVar29._8_8_;
    auVar28._4_4_ = iVar15;
    auVar28._0_4_ = iVar15;
    uVar9 = movmskpd((int)CONCAT71(extraout_var,bVar8),auVar28);
    fVar14 = 0.0;
    if (((uVar9 & 2) == 0) && (fVar14 = 1.0, fVar22 <= 1.0)) {
      fVar14 = fVar22;
    }
    _local_108 = ZEXT416((uint)((fVar14 * fVar36) / (float)local_e8));
    if (((local_a8[0] & (byte)uVar9) == 1) && (held != false)) {
      local_88 = ZEXT416((uint)fVar13);
      local_98._4_4_ = local_e8._4_4_;
      local_98._0_4_ = fVar36;
      fStack_90 = fStack_e0;
      fStack_8c = fStack_dc;
      local_f8._0_8_ = &window->Scroll;
      pIVar6 = (ImRect *)&local_118.Min.y;
      if (axis == ImGuiAxis_X) {
        pIVar6 = &local_118;
      }
      uVar2 = (ulong)(axis != ImGuiAxis_X);
      local_78 = ZEXT416((uint)(*(float *)((pIVar3->IO).MouseDown + uVar2 * 4 + -8) -
                               (pIVar6->Min).x));
      local_a8 = auVar35;
      SetHoveredID(id);
      fVar14 = (float)local_78._0_4_ / (float)local_e8;
      fVar13 = 1.0;
      if (fVar14 <= 1.0) {
        fVar13 = fVar14;
      }
      fVar13 = (float)(~-(uint)(fVar14 < 0.0) & (uint)fVar13);
      if (local_ac == id) {
        fVar14 = (&(pIVar3->ScrollbarClickDeltaToGrabCenter).x)[uVar2];
        bVar8 = false;
      }
      else if ((fVar13 < (float)local_108._0_4_) ||
              ((float)local_a8._0_4_ + (float)local_108._0_4_ < fVar13)) {
        (&(pIVar3->ScrollbarClickDeltaToGrabCenter).x)[uVar2] = 0.0;
        bVar8 = true;
        fVar14 = 0.0;
      }
      else {
        fVar14 = (float)local_a8._0_4_ * -0.5 + (fVar13 - (float)local_108._0_4_);
        (&(pIVar3->ScrollbarClickDeltaToGrabCenter).x)[uVar2] = fVar14;
        bVar8 = false;
      }
      fVar22 = ((fVar13 - fVar14) - (float)local_a8._0_4_ * 0.5) / (1.0 - (float)local_a8._0_4_);
      fVar14 = 1.0;
      if (fVar22 <= 1.0) {
        fVar14 = fVar22;
      }
      fVar14 = (float)(int)((float)(~-(uint)(fVar22 < 0.0) & (uint)fVar14) * (float)local_88._0_4_ +
                           0.5);
      if (axis == ImGuiAxis_X) {
        pfVar7 = (float *)local_f8._0_8_;
      }
      *pfVar7 = fVar14;
      fVar14 = fVar14 / (float)local_88._0_4_;
      fVar22 = 1.0;
      if (fVar14 <= 1.0) {
        fVar22 = fVar14;
      }
      local_108._0_4_ =
           ((float)local_98._0_4_ * (float)(~-(uint)(fVar14 < 0.0) & (uint)fVar22)) /
           (float)local_e8;
      local_108._4_4_ = local_98._4_4_;
      fStack_100 = fStack_90;
      fStack_fc = fStack_8c;
      if (bVar8) {
        (&(pIVar3->ScrollbarClickDeltaToGrabCenter).x)[uVar2] =
             -(float)local_a8._0_4_ * 0.5 + (fVar13 - (float)local_108._0_4_);
      }
    }
    idx = 0x11;
    if (held == false) {
      idx = (hovered & 1) + 0xf;
    }
    IVar4 = GetColorU32(idx,(float)local_c8._0_4_);
    if (axis == ImGuiAxis_X) {
      local_40.x = local_118.Min.x + (local_118.Max.x - local_118.Min.x) * (float)local_108._0_4_;
      local_38.x = (float)local_d8._0_4_ + local_40.x;
      local_38.y = local_118.Max.y;
      local_40.y = local_118.Min.y;
      if (local_68.x <= (float)local_d8._0_4_ + local_40.x) {
        local_38.x = local_68.x;
      }
    }
    else {
      local_40.y = (local_118.Max.y - local_118.Min.y) * (float)local_108._0_4_ + local_118.Min.y;
      local_38.y = (float)local_d8._0_4_ + local_40.y;
      local_38.x = local_118.Max.x;
      local_40.x = local_118.Min.x;
      if (local_58 <= local_38.y) {
        local_38.y = local_58;
      }
    }
    ImDrawList::AddRectFilled
              (window->DrawList,&local_40,&local_38,IVar4,(pIVar3->Style).ScrollbarRounding,0xf);
    return;
  }
  __assert_fail("ImMax(win_size_contents_v, win_size_avail_v) > 0.0f",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui_widgets.cpp"
                ,0x342,"void ImGui::Scrollbar(ImGuiAxis)");
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const bool horizontal = (axis == ImGuiAxis_X);
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = GetScrollbarID(window, axis);
    KeepAliveID(id);

    // Render background
    bool other_scrollbar = (horizontal ? window->ScrollbarY : window->ScrollbarX);
    float other_scrollbar_size_w = other_scrollbar ? style.ScrollbarSize : 0.0f;
    const ImRect host_rect = window->Rect();
    const float border_size = window->WindowBorderSize;
    ImRect bb = horizontal
        ? ImRect(host_rect.Min.x + border_size, host_rect.Max.y - style.ScrollbarSize, host_rect.Max.x - other_scrollbar_size_w - border_size, host_rect.Max.y - border_size)
        : ImRect(host_rect.Max.x - style.ScrollbarSize, host_rect.Min.y + border_size, host_rect.Max.x - border_size, host_rect.Max.y - other_scrollbar_size_w - border_size);
    bb.Min.x = ImMax(host_rect.Min.x, bb.Min.x); // Handle case where the host rectangle is smaller than the scrollbar
    bb.Min.y = ImMax(host_rect.Min.y, bb.Min.y);
    if (!horizontal)
        bb.Min.y += window->TitleBarHeight() + ((window->Flags & ImGuiWindowFlags_MenuBar) ? window->MenuBarHeight() : 0.0f); // FIXME: InnerRect?

    const float bb_width = bb.GetWidth();
    const float bb_height = bb.GetHeight();
    if (bb_width <= 0.0f || bb_height <= 0.0f)
        return;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
    {
        alpha = ImSaturate((bb_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
        if (alpha <= 0.0f)
            return;
    }
    const bool allow_interaction = (alpha >= 1.0f);

    int window_rounding_corners;
    if (horizontal)
        window_rounding_corners = ImDrawCornerFlags_BotLeft | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    else
        window_rounding_corners = (((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? ImDrawCornerFlags_TopRight : 0) | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_ScrollbarBg), window->WindowRounding, window_rounding_corners);
    bb.Expand(ImVec2(-ImClamp((float)(int)((bb_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp((float)(int)((bb_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    float scrollbar_size_v = horizontal ? bb.GetWidth() : bb.GetHeight();
    float scroll_v = horizontal ? window->Scroll.x : window->Scroll.y;
    float win_size_avail_v = (horizontal ? window->SizeFull.x : window->SizeFull.y) - other_scrollbar_size_w;
    float win_size_contents_v = horizontal ? window->SizeContents.x : window->SizeContents.y;

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(win_size_contents_v, win_size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(win_size_contents_v, win_size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (win_size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    const bool previously_held = (g.ActiveId == id);
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, win_size_contents_v - win_size_avail_v);
    float scroll_ratio = ImSaturate(scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = horizontal ? bb.Min.x : bb.Min.y;
        float mouse_pos_v = horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;
        float* click_delta_to_grab_center_v = horizontal ? &g.ScrollbarClickDeltaToGrabCenter.x : &g.ScrollbarClickDeltaToGrabCenter.y;

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (!previously_held)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            if (clicked_v_norm >= grab_v_norm && clicked_v_norm <= grab_v_norm + grab_h_norm)
            {
                *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
            }
            else
            {
                seek_absolute = true;
                *click_delta_to_grab_center_v = 0.0f;
            }
        }

        // Apply scroll
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of SizeContents and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - *click_delta_to_grab_center_v - grab_h_norm*0.5f) / (1.0f - grab_h_norm));
        scroll_v = (float)(int)(0.5f + scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));
        if (horizontal)
            window->Scroll.x = scroll_v;
        else
            window->Scroll.y = scroll_v;

        // Update values for rendering
        scroll_ratio = ImSaturate(scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
    }

    // Render grab
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    ImRect grab_rect;
    if (horizontal)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImMin(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, host_rect.Max.x), bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImMin(ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels, host_rect.Max.y));
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);
}